

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::internal::
parse_format_string<false,wchar_t,fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>&>
          (internal *this,basic_string_view<wchar_t> format_str,
          format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
          *handler)

{
  bool bVar1;
  wchar_t *pwVar2;
  size_t sVar3;
  wchar_t *end_00;
  wchar_t local_5c;
  id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
  iStack_48;
  wchar_t c;
  wchar_t *local_40;
  wchar_t *p;
  wchar_t *end;
  wchar_t *begin;
  writer write;
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  *handler_local;
  basic_string_view<wchar_t> format_str_local;
  
  begin = (wchar_t *)format_str.size_;
  format_str_local.data_ = format_str.data_;
  write.handler_ =
       (format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        *)begin;
  handler_local =
       (format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        *)this;
  pwVar2 = basic_string_view<wchar_t>::data((basic_string_view<wchar_t> *)&handler_local);
  end = pwVar2;
  sVar3 = basic_string_view<wchar_t>::size((basic_string_view<wchar_t> *)&handler_local);
  p = pwVar2 + sVar3;
  do {
    if (end == p) {
      return;
    }
    local_40 = end;
    if ((*end != L'{') && (bVar1 = find<false,char,wchar_t_const*>(end,p,'{',&local_40), !bVar1)) {
      parse_format_string<false,_wchar_t,_fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_&>
      ::writer::operator()((writer *)&begin,end,p);
      return;
    }
    parse_format_string<false,_wchar_t,_fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_&>
    ::writer::operator()((writer *)&begin,end,local_40);
    pwVar2 = local_40 + 1;
    if (pwVar2 == p) {
      local_40 = pwVar2;
      error_handler::on_error((error_handler *)write.handler_,"invalid format string");
      return;
    }
    if ((char)*pwVar2 == '}') {
      local_40 = pwVar2;
      format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
      ::on_arg_id(write.handler_);
      format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
      ::on_replacement_field(write.handler_,local_40);
    }
    else if (*pwVar2 == L'{') {
      end_00 = local_40 + 2;
      local_40 = pwVar2;
      format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
      ::on_text(write.handler_,pwVar2,end_00);
    }
    else {
      iStack_48.handler = write.handler_;
      local_40 = pwVar2;
      local_40 = parse_arg_id<wchar_t,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>,wchar_t,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>&,wchar_t>>
                           (pwVar2,p,&stack0xffffffffffffffb8);
      if (local_40 == p) {
        local_5c = L'\0';
      }
      else {
        local_5c = *local_40;
      }
      if (local_5c == L'}') {
        format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        ::on_replacement_field(write.handler_,local_40);
      }
      else {
        if (local_5c != L':') {
          error_handler::on_error((error_handler *)write.handler_,"missing \'}\' in format string");
          return;
        }
        local_40 = format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>,_wchar_t,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                   ::on_format_specs(write.handler_,local_40 + 1,p);
        if ((local_40 == p) || (*local_40 != L'}')) {
          error_handler::on_error((error_handler *)write.handler_,"unknown format specifier");
          return;
        }
      }
    }
    end = local_40 + 1;
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(
        basic_string_view<Char> format_str, Handler &&handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char *begin, const Char *end) {
      if (begin == end) return;
      for (;;) {
        const Char *p = FMT_NULL;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler &handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char *p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end)
      return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}